

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<char>::copyAppend(QPodArrayOps<char> *this,qsizetype n,parameter_type t)

{
  char *pcVar1;
  char in_DL;
  long in_RSI;
  long in_RDI;
  char *where;
  QArrayDataPointer<char> *in_stack_ffffffffffffffe0;
  long local_10;
  
  if (in_RSI != 0) {
    pcVar1 = QArrayDataPointer<char>::end(in_stack_ffffffffffffffe0);
    *(long *)(in_RDI + 0x10) = in_RSI + *(long *)(in_RDI + 0x10);
    local_10 = in_RSI;
    while (local_10 != 0) {
      *pcVar1 = in_DL;
      pcVar1 = pcVar1 + 1;
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t) noexcept
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *where = this->end();
        this->size += qsizetype(n);
        while (n--)
            *where++ = t;
    }